

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequences.hpp
# Opt level: O0

iterator_range<burst::subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>_>
* __thiscall
burst::subsequences<std::initializer_list<int>const&>
          (iterator_range<burst::subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>_>
           *__return_storage_ptr__,burst *this,initializer_list<int> *range)

{
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_> *in_RCX
  ;
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  local_f0;
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  local_c0;
  undefined1 local_78 [8];
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_> end;
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_> begin;
  initializer_list<int> *range_local;
  
  make_subsequence_iterator<std::initializer_list<int>const&>
            ((subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
              *)&end.m_subsequence_size,this,range);
  make_subsequence_iterator<int_const*>(local_78,(burst *)&end.m_subsequence_size);
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>::
  subsequence_iterator
            (&local_c0,
             (subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
              *)&end.m_subsequence_size);
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>::
  subsequence_iterator
            (&local_f0,
             (subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
              *)local_78);
  boost::
  make_iterator_range<burst::subsequence_iterator<int_const*,std::vector<int_const*,std::allocator<int_const*>>>>
            (__return_storage_ptr__,(boost *)&local_c0,&local_f0,in_RCX);
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>::
  ~subsequence_iterator(&local_f0);
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>::
  ~subsequence_iterator(&local_c0);
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>::
  ~subsequence_iterator
            ((subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
              *)local_78);
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>::
  ~subsequence_iterator
            ((subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
              *)&end.m_subsequence_size);
  return __return_storage_ptr__;
}

Assistant:

auto subsequences (ForwardRange && range)
    {
        auto begin = make_subsequence_iterator(std::forward<ForwardRange>(range));
        auto end = make_subsequence_iterator(iterator::end_tag, begin);

        return boost::make_iterator_range(std::move(begin), std::move(end));
    }